

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlobIOSystem.h
# Opt level: O1

size_t __thiscall
Assimp::BlobIOStream::Write(BlobIOStream *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  size_t need;
  size_t __n;
  ulong uVar1;
  
  __n = pSize * pCount;
  need = this->cursor + __n;
  if (this->cur_size < need) {
    Grow(this,need);
  }
  memcpy(this->buffer + this->cursor,pvBuffer,__n);
  uVar1 = __n + this->cursor;
  this->cursor = uVar1;
  if (uVar1 < this->file_size) {
    uVar1 = this->file_size;
  }
  this->file_size = uVar1;
  return pCount;
}

Assistant:

virtual size_t Write(const void* pvBuffer,
        size_t pSize,
        size_t pCount)
    {
        pSize *= pCount;
        if (cursor + pSize > cur_size) {
            Grow(cursor + pSize);
        }

        memcpy(buffer+cursor, pvBuffer, pSize);
        cursor += pSize;

        file_size = std::max(file_size,cursor);
        return pCount;
    }